

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O2

void __thiscall fasttext::QuantMatrix::quantizeNorm(QuantMatrix *this,Vector *norms)

{
  size_t sVar1;
  real *x;
  uint __line;
  char *__assertion;
  
  if (this->qnorm_ == false) {
    __assertion = "qnorm_";
    __line = 0x21;
  }
  else {
    sVar1 = (norms->data_).size_;
    if (sVar1 == (this->super_Matrix).m_) {
      x = (norms->data_).mem_;
      ProductQuantizer::train
                ((this->npq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                 (int32_t)sVar1,x);
      ProductQuantizer::compute_codes
                ((this->npq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
                 (this->norm_codes_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,(int32_t)(this->super_Matrix).m_);
      return;
    }
    __assertion = "norms.size() == m_";
    __line = 0x22;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/quantmatrix.cc"
                ,__line,"void fasttext::QuantMatrix::quantizeNorm(const Vector &)");
}

Assistant:

void QuantMatrix::quantizeNorm(const Vector& norms) {
  assert(qnorm_);
  assert(norms.size() == m_);
  auto dataptr = norms.data();
  npq_->train(m_, dataptr);
  npq_->compute_codes(dataptr, norm_codes_.data(), m_);
}